

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetCompilePDBPath
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  ulong uVar1;
  string local_90;
  undefined1 local_60 [8];
  string name;
  string dir;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  GetCompilePDBDirectory((string *)((long)&name.field_2 + 8),this,config);
  GetCompilePDBName((string *)local_60,this,config);
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) != 0) && (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
    GetPDBDirectory(&local_90,this,config);
    std::__cxx11::string::operator=((string *)(name.field_2._M_local_buf + 8),(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)(name.field_2._M_local_buf + 8),"/");
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string
cmGeneratorTarget::GetCompilePDBPath(const std::string& config) const
{
  std::string dir = this->GetCompilePDBDirectory(config);
  std::string name = this->GetCompilePDBName(config);
  if(dir.empty() && !name.empty())
    {
    dir = this->GetPDBDirectory(config);
    }
  if(!dir.empty())
    {
    dir += "/";
    }
  return dir + name;
}